

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fuse_innerproduct_activation(NetOptimize *this)

{
  string *__lhs;
  int iVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  pointer ppLVar4;
  Layer *pLVar5;
  long *plVar6;
  undefined4 *puVar7;
  bool bVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Mat local_88;
  ulong local_38;
  
  pvVar2 = (this->super_ModelWriter).layers;
  uVar12 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3;
  local_38 = 1;
  uVar11 = 0;
  do {
    if (uVar11 == uVar12) {
      return 0;
    }
    bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar11]->type,"InnerProduct");
    if (!bVar8) {
      iVar1 = *((((this->super_ModelWriter).layers)->
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar11]->tops).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (uVar10 = local_38; uVar10 < uVar12; uVar10 = uVar10 + 1) {
        bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar10]->type,"ReLU");
        if (((((!bVar8) ||
              (bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar10]->type,
                                       "Clip"), !bVar8)) ||
             (bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar10]->type,
                                      "Sigmoid"), !bVar8)) ||
            ((bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar10]->type,
                                      "Mish"), !bVar8 ||
             (bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar10]->type,
                                      "HardSwish"), !bVar8)))) &&
           ((pLVar3 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar10],
            piVar9 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar9 == 4 && (*piVar9 == iVar1)))) {
          if (uVar12 != uVar10) {
            ppLVar4 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar3 = ppLVar4[uVar11];
            pLVar5 = ppLVar4[uVar10];
            fprintf(_stderr,"fuse_innerproduct_activation %s %s\n",(pLVar3->name)._M_dataplus._M_p);
            __lhs = &pLVar5->type;
            bVar8 = std::operator==(__lhs,"ReLU");
            if (bVar8) {
              if ((*(float *)&pLVar5[1]._vptr_Layer != 0.0) ||
                 (NAN(*(float *)&pLVar5[1]._vptr_Layer))) {
                pLVar3[1].support_tensor_storage = true;
                pLVar3[1].support_reserved_00 = false;
                pLVar3[1].support_reserved_0 = false;
                pLVar3[1].support_reserved_1 = false;
                local_88.cstep = 0;
                local_88.data = (void *)0x0;
                local_88.refcount._0_4_ = 0;
                local_88.refcount._4_4_ = 0;
                local_88.elemsize._0_4_ = 0;
                local_88.elemsize._4_4_ = 0;
                local_88.elempack = 0;
                local_88.h = 0;
                local_88.d = 0;
                local_88.c = 0;
                local_88.allocator = (Allocator *)0x0;
                local_88.dims = 0;
                local_88.w = 0;
                ncnn::Mat::create(&local_88,1,4,(Allocator *)0x0);
                piVar9 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                if ((Mat *)&pLVar3[1].support_reserved_6 != &local_88) {
                  if (piVar9 != (int *)0x0) {
                    LOCK();
                    *piVar9 = *piVar9 + 1;
                    UNLOCK();
                  }
                  piVar9 = (int *)pLVar3[1].userdata;
                  if (piVar9 != (int *)0x0) {
                    LOCK();
                    *piVar9 = *piVar9 + -1;
                    UNLOCK();
                    if (*piVar9 == 0) {
                      plVar6 = (long *)pLVar3[1].type._M_string_length;
                      if (plVar6 == (long *)0x0) {
                        free(*(void **)&pLVar3[1].support_reserved_6);
                      }
                      else {
                        (**(code **)(*plVar6 + 0x18))();
                      }
                    }
                  }
                  *(void **)&pLVar3[1].support_reserved_6 = local_88.data;
                  piVar9 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                  pLVar3[1].userdata = piVar9;
                  *(ulong *)&pLVar3[1].typeindex =
                       CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
                  *(int *)&pLVar3[1].type._M_dataplus._M_p = local_88.elempack;
                  pLVar3[1].type._M_string_length = (size_type)local_88.allocator;
                  *(int *)&pLVar3[1].type.field_2 = local_88.dims;
                  *(int *)((long)&pLVar3[1].type.field_2 + 4) = local_88.w;
                  *(int *)((long)&pLVar3[1].type.field_2 + 8) = local_88.h;
                  *(int *)((long)&pLVar3[1].type.field_2 + 0xc) = local_88.d;
                  *(int *)&pLVar3[1].name._M_dataplus._M_p = local_88.c;
                  pLVar3[1].name._M_string_length = local_88.cstep;
                }
                if (piVar9 != (int *)0x0) {
                  LOCK();
                  *piVar9 = *piVar9 + -1;
                  UNLOCK();
                  if (*piVar9 == 0) {
                    if (local_88.allocator == (Allocator *)0x0) {
                      free(local_88.data);
                    }
                    else {
                      (*(local_88.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                **(undefined4 **)&pLVar3[1].support_reserved_6 =
                     *(undefined4 *)&pLVar5[1]._vptr_Layer;
              }
              else {
                pLVar3[1].support_tensor_storage = true;
                pLVar3[1].support_reserved_00 = false;
                pLVar3[1].support_reserved_0 = false;
                pLVar3[1].support_reserved_1 = false;
              }
            }
            else {
              bVar8 = std::operator==(__lhs,"Clip");
              if (bVar8) {
                pLVar3[1].support_tensor_storage = true;
                pLVar3[1].support_reserved_00 = false;
                pLVar3[1].support_reserved_0 = false;
                pLVar3[1].support_reserved_1 = false;
                local_88.cstep = 0;
                local_88.data = (void *)0x0;
                local_88.refcount._0_4_ = 0;
                local_88.refcount._4_4_ = 0;
                local_88.elemsize._0_4_ = 0;
                local_88.elemsize._4_4_ = 0;
                local_88.elempack = 0;
                local_88.h = 0;
                local_88.d = 0;
                local_88.c = 0;
                local_88.allocator = (Allocator *)0x0;
                local_88.dims = 0;
                local_88.w = 0;
                ncnn::Mat::create(&local_88,2,4,(Allocator *)0x0);
                piVar9 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                if ((Mat *)&pLVar3[1].support_reserved_6 != &local_88) {
                  if (piVar9 != (int *)0x0) {
                    LOCK();
                    *piVar9 = *piVar9 + 1;
                    UNLOCK();
                  }
                  piVar9 = (int *)pLVar3[1].userdata;
                  if (piVar9 != (int *)0x0) {
                    LOCK();
                    *piVar9 = *piVar9 + -1;
                    UNLOCK();
                    if (*piVar9 == 0) {
                      plVar6 = (long *)pLVar3[1].type._M_string_length;
                      if (plVar6 == (long *)0x0) {
                        free(*(void **)&pLVar3[1].support_reserved_6);
                      }
                      else {
                        (**(code **)(*plVar6 + 0x18))();
                      }
                    }
                  }
                  *(void **)&pLVar3[1].support_reserved_6 = local_88.data;
                  piVar9 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                  pLVar3[1].userdata = piVar9;
                  *(ulong *)&pLVar3[1].typeindex =
                       CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
                  *(int *)&pLVar3[1].type._M_dataplus._M_p = local_88.elempack;
                  pLVar3[1].type._M_string_length = (size_type)local_88.allocator;
                  *(int *)&pLVar3[1].type.field_2 = local_88.dims;
                  *(int *)((long)&pLVar3[1].type.field_2 + 4) = local_88.w;
                  *(int *)((long)&pLVar3[1].type.field_2 + 8) = local_88.h;
                  *(int *)((long)&pLVar3[1].type.field_2 + 0xc) = local_88.d;
                  *(int *)&pLVar3[1].name._M_dataplus._M_p = local_88.c;
                  pLVar3[1].name._M_string_length = local_88.cstep;
                }
                if (piVar9 != (int *)0x0) {
                  LOCK();
                  *piVar9 = *piVar9 + -1;
                  UNLOCK();
                  if (*piVar9 == 0) {
                    if (local_88.allocator == (Allocator *)0x0) {
LAB_00132d26:
                      free(local_88.data);
                    }
                    else {
                      (*(local_88.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
LAB_00132d36:
                puVar7 = *(undefined4 **)&pLVar3[1].support_reserved_6;
                *puVar7 = *(undefined4 *)&pLVar5[1]._vptr_Layer;
                puVar7[1] = *(undefined4 *)((long)&pLVar5[1]._vptr_Layer + 4);
              }
              else {
                bVar8 = std::operator==(__lhs,"Sigmoid");
                if (bVar8) {
                  pLVar3[1].support_tensor_storage = true;
                  pLVar3[1].support_reserved_00 = false;
                  pLVar3[1].support_reserved_0 = false;
                  pLVar3[1].support_reserved_1 = false;
                }
                else {
                  bVar8 = std::operator==(__lhs,"Mish");
                  if (bVar8) {
                    pLVar3[1].support_tensor_storage = true;
                    pLVar3[1].support_reserved_00 = false;
                    pLVar3[1].support_reserved_0 = false;
                    pLVar3[1].support_reserved_1 = false;
                  }
                  else {
                    bVar8 = std::operator==(__lhs,"HardSwish");
                    if (bVar8) {
                      pLVar3[1].support_tensor_storage = true;
                      pLVar3[1].support_reserved_00 = false;
                      pLVar3[1].support_reserved_0 = false;
                      pLVar3[1].support_reserved_1 = false;
                      local_88.cstep = 0;
                      local_88.data = (void *)0x0;
                      local_88.refcount._0_4_ = 0;
                      local_88.refcount._4_4_ = 0;
                      local_88.elemsize._0_4_ = 0;
                      local_88.elemsize._4_4_ = 0;
                      local_88.elempack = 0;
                      local_88.h = 0;
                      local_88.d = 0;
                      local_88.c = 0;
                      local_88.allocator = (Allocator *)0x0;
                      local_88.dims = 0;
                      local_88.w = 0;
                      ncnn::Mat::create(&local_88,2,4,(Allocator *)0x0);
                      piVar9 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                      if ((Mat *)&pLVar3[1].support_reserved_6 != &local_88) {
                        if (piVar9 != (int *)0x0) {
                          LOCK();
                          *piVar9 = *piVar9 + 1;
                          UNLOCK();
                        }
                        piVar9 = (int *)pLVar3[1].userdata;
                        if (piVar9 != (int *)0x0) {
                          LOCK();
                          *piVar9 = *piVar9 + -1;
                          UNLOCK();
                          if (*piVar9 == 0) {
                            plVar6 = (long *)pLVar3[1].type._M_string_length;
                            if (plVar6 == (long *)0x0) {
                              free(*(void **)&pLVar3[1].support_reserved_6);
                            }
                            else {
                              (**(code **)(*plVar6 + 0x18))();
                            }
                          }
                        }
                        *(void **)&pLVar3[1].support_reserved_6 = local_88.data;
                        piVar9 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                        pLVar3[1].userdata = piVar9;
                        *(ulong *)&pLVar3[1].typeindex =
                             CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
                        *(int *)&pLVar3[1].type._M_dataplus._M_p = local_88.elempack;
                        pLVar3[1].type._M_string_length = (size_type)local_88.allocator;
                        *(int *)&pLVar3[1].type.field_2 = local_88.dims;
                        *(int *)((long)&pLVar3[1].type.field_2 + 4) = local_88.w;
                        *(int *)((long)&pLVar3[1].type.field_2 + 8) = local_88.h;
                        *(int *)((long)&pLVar3[1].type.field_2 + 0xc) = local_88.d;
                        *(int *)&pLVar3[1].name._M_dataplus._M_p = local_88.c;
                        pLVar3[1].name._M_string_length = local_88.cstep;
                      }
                      if (piVar9 != (int *)0x0) {
                        LOCK();
                        *piVar9 = *piVar9 + -1;
                        UNLOCK();
                        if (*piVar9 == 0) {
                          if (local_88.allocator == (Allocator *)0x0) goto LAB_00132d26;
                          (*(local_88.allocator)->_vptr_Allocator[3])();
                        }
                      }
                      goto LAB_00132d36;
                    }
                  }
                }
              }
            }
            iVar1 = *(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar1;
            (((this->super_ModelWriter).blobs)->
            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar1].producer = (int)uVar11;
            std::__cxx11::string::assign((char *)__lhs);
          }
          break;
        }
      }
    }
    uVar11 = uVar11 + 1;
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_innerproduct_activation()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - Activation
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "ReLU" && layers[j]->type != "Clip" && layers[j]->type != "Sigmoid" && layers[j]->type != "Mish" && layers[j]->type != "HardSwish")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse InnerProduct - Activation to InnerProduct
        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::Layer* activation = layers[j];

        fprintf(stderr, "fuse_innerproduct_activation %s %s\n", innerproduct->name.c_str(), activation->name.c_str());

        if (activation->type == "ReLU")
        {
            ncnn::ReLU* relu = (ncnn::ReLU*)activation;

            if (relu->slope == 0.f)
            {
                innerproduct->activation_type = 1;
            }
            else
            {
                innerproduct->activation_type = 2;
                innerproduct->activation_params = ncnn::Mat(1);
                innerproduct->activation_params[0] = relu->slope;
            }
        }
        else if (activation->type == "Clip")
        {
            ncnn::Clip* clip = (ncnn::Clip*)activation;

            innerproduct->activation_type = 3;
            innerproduct->activation_params = ncnn::Mat(2);
            innerproduct->activation_params[0] = clip->min;
            innerproduct->activation_params[1] = clip->max;
        }
        else if (activation->type == "Sigmoid")
        {
            innerproduct->activation_type = 4;
        }
        else if (activation->type == "Mish")
        {
            innerproduct->activation_type = 5;
        }
        else if (activation->type == "HardSwish")
        {
            ncnn::HardSwish* hardswish = (ncnn::HardSwish*)activation;

            innerproduct->activation_type = 6;
            innerproduct->activation_params = ncnn::Mat(2);
            innerproduct->activation_params[0] = hardswish->alpha;
            innerproduct->activation_params[1] = hardswish->beta;
        }

        int top_blob_index_final = activation->tops[0];
        innerproduct->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        activation->type = "ncnnfused";
    }

    return 0;
}